

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

string * __thiscall TCLAP::Arg::shortID(string *__return_storage_ptr__,Arg *this,string *valueId)

{
  bool bVar1;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  allocator<char> local_22;
  undefined1 local_21;
  string *local_20;
  string *valueId_local;
  Arg *this_local;
  string *id;
  
  local_21 = 0;
  local_20 = valueId;
  valueId_local = (string *)this;
  this_local = (Arg *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_22);
  std::allocator<char>::~allocator(&local_22);
  bVar1 = std::operator!=(&this->_flag,"");
  if (bVar1) {
    flagStartString_abi_cxx11_();
    std::operator+(&local_58,&local_78,&this->_flag);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    nameStartString_abi_cxx11_();
    std::operator+(&local_98,&local_b8,&this->_name);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((this->_valueRequired & 1U) != 0) {
    __c = delimiter();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,1,__c,&local_139);
    std::operator+(&local_118,&local_138,"<");
    std::operator+(&local_f8,&local_118,local_20);
    std::operator+(&local_d8,&local_f8,">");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
  }
  if ((this->_required & 1U) == 0) {
    std::operator+(&local_180,"[",__return_storage_ptr__);
    std::operator+(&local_160,&local_180,"]");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Arg::shortID( const std::string& valueId ) const
{
	std::string id = "";

	if ( _flag != "" )
		id = Arg::flagStartString() + _flag;
	else
		id = Arg::nameStartString() + _name;

	if ( _valueRequired )
		id += std::string( 1, Arg::delimiter() ) + "<" + valueId  + ">";

	if ( !_required )
		id = "[" + id + "]";

	return id;
}